

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O2

void __thiscall
wasm::ModuleSplitting::anon_unknown_0::ModuleSplitter::exportImportFunction
          (ModuleSplitter *this,Name funcName)

{
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *this_00;
  Config *pCVar1;
  Module *pMVar2;
  char *pcVar3;
  Name name;
  Name name_00;
  iterator iVar4;
  Export *pEVar5;
  string_view *psVar6;
  Function *pFVar7;
  string_view name_01;
  Name name_02;
  string_view local_c0;
  undefined1 local_ac [20];
  _Alloc_hider local_98;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string_view local_50;
  undefined1 auStack_40 [8];
  Name funcName_local;
  
  funcName_local.super_IString.str._M_len = funcName.super_IString.str._M_str;
  auStack_40 = funcName.super_IString.str._M_len;
  this_00 = &this->exportedPrimaryFuncs;
  iVar4 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
          ::find(&this_00->_M_t,(key_type *)auStack_40);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header) {
    pCVar1 = this->config;
    local_ac._12_8_ = this_00;
    if (pCVar1->minimizeNewExportNames == true) {
      local_ac._4_8_ = &this->minified;
      do {
        pCVar1 = this->config;
        Names::MinifiedNameGenerator::getName_abi_cxx11_
                  ((string *)&stack0xffffffffffffff68,(MinifiedNameGenerator *)local_ac._4_8_);
        std::operator+(&local_78,&pCVar1->newExportPrefix,(string *)&stack0xffffffffffffff68);
        IString::IString((IString *)&local_50,&local_78);
        name_01 = local_50;
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
        pEVar5 = Module::getExportOrNull(this->primary,(Name)name_01);
      } while (pEVar5 != (Export *)0x0);
    }
    else {
      pMVar2 = this->primary;
      IString::toString_abi_cxx11_((string *)&stack0xffffffffffffff68,(IString *)auStack_40);
      std::operator+(&local_78,&pCVar1->newExportPrefix,(string *)&stack0xffffffffffffff68);
      IString::IString((IString *)&local_c0,&local_78);
      name_01 = (string_view)Names::getValidExportName(pMVar2,(Name)local_c0);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    }
    pMVar2 = this->primary;
    local_78._M_dataplus._M_p = (pointer)auStack_40;
    local_78._M_string_length = funcName_local.super_IString.str._M_len;
    local_78.field_2._M_allocated_capacity =
         local_78.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_ac._0_4_ = 0;
    _local_98 = name_01;
    std::
    make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
              ((Name *)&local_50,(ExternalKind *)&stack0xffffffffffffff68,
               (variant<wasm::Name,_wasm::HeapType> *)local_ac);
    Module::addExport(pMVar2,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                             &local_50);
    std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
              ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&local_50);
    psVar6 = (string_view *)
             std::
             map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
             ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                           *)local_ac._12_8_,(key_type *)auStack_40);
    *psVar6 = name_01;
  }
  else {
    name_01._M_len = (size_t)iVar4._M_node[1]._M_left;
    name_01._M_str = (char *)iVar4._M_node[1]._M_right;
  }
  name.super_IString.str._M_str = (char *)funcName_local.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)auStack_40;
  pFVar7 = Module::getFunctionOrNull(this->secondary,name);
  if (pFVar7 == (Function *)0x0) {
    name_00.super_IString.str._M_str = (char *)funcName_local.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)auStack_40;
    pFVar7 = Module::getFunction(this->primary,name_00);
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    name_02.super_IString.str._M_str = (char *)auStack_40;
    name_02.super_IString.str._M_len = (size_t)&stack0xffffffffffffff68;
    Builder::makeFunction
              (name_02,(HeapType)funcName_local.super_IString.str._M_len,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)(pFVar7->type).id,
               (Expression *)&local_78);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&local_78);
    local_98._M_p[0x10] = (pFVar7->super_Importable).super_Named.hasExplicitName;
    pcVar3 = (this->config->importNamespace).super_IString.str._M_str;
    *(size_t *)(local_98._M_p + 0x18) = (this->config->importNamespace).super_IString.str._M_len;
    *(char **)(local_98._M_p + 0x20) = pcVar3;
    *(string_view *)(local_98._M_p + 0x28) = name_01;
    Module::addFunction(this->secondary,
                        (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        &stack0xffffffffffffff68);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
               &stack0xffffffffffffff68);
  }
  return;
}

Assistant:

void ModuleSplitter::exportImportFunction(Name funcName) {
  Name exportName;
  // If the function is already exported, use the existing export name.
  // Otherwise, create a new export for it.
  auto exportIt = exportedPrimaryFuncs.find(funcName);
  if (exportIt != exportedPrimaryFuncs.end()) {
    exportName = exportIt->second;
  } else {
    if (config.minimizeNewExportNames) {
      do {
        exportName = config.newExportPrefix + minified.getName();
      } while (primary.getExportOrNull(exportName) != nullptr);
    } else {
      exportName = Names::getValidExportName(
        primary, config.newExportPrefix + funcName.toString());
    }
    primary.addExport(
      Builder::makeExport(exportName, funcName, ExternalKind::Function));
    exportedPrimaryFuncs[funcName] = exportName;
  }
  // Import the function if it is not already imported into the secondary
  // module.
  if (secondary.getFunctionOrNull(funcName) == nullptr) {
    auto primaryFunc = primary.getFunction(funcName);
    auto func = Builder::makeFunction(funcName, primaryFunc->type, {});
    func->hasExplicitName = primaryFunc->hasExplicitName;
    func->module = config.importNamespace;
    func->base = exportName;
    secondary.addFunction(std::move(func));
  }
}